

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_xpath(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  xmlXPathObjectPtr pxVar8;
  xmlNodePtr val;
  undefined8 uVar9;
  xmlChar *pxVar10;
  xmlDocPtr pxVar11;
  xmlDocPtr pxVar12;
  int nr;
  int extraout_EDX;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int test_ret;
  int iVar13;
  int test_ret_6;
  xmlDocPtr in_RSI;
  ulong uVar14;
  int test_ret_1;
  int test_ret_8;
  bool bVar15;
  int n_val;
  uint uVar16;
  ulong uVar17;
  undefined1 auVar18 [12];
  int local_98;
  int test_ret_7;
  int local_90;
  int local_8c;
  int test_ret_5;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int test_ret_2;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int test_ret_3;
  int local_44;
  int test_ret_4;
  int local_3c;
  int local_38;
  
  if (quiet == '\0') {
    puts("Testing xpath : 32 of 40 functions ...");
  }
  iVar13 = 0;
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    iVar1 = xmlMemBlocks();
    gen_int(uVar16,(int)in_RSI);
    xmlXPathCastBooleanToNumber();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToNumber",(ulong)(uint)(iVar2 - iVar1));
      iVar13 = iVar13 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  pxVar12 = (xmlDocPtr)0x0;
  while (iVar2 = (int)pxVar12, iVar2 != 4) {
    iVar3 = xmlMemBlocks();
    gen_int(iVar2,(int)in_RSI);
    lVar7 = xmlXPathCastBooleanToString();
    if (lVar7 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar4 = xmlMemBlocks();
    if (iVar3 != iVar4) {
      iVar4 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastBooleanToString",(ulong)(uint)(iVar4 - iVar3));
      iVar1 = iVar1 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar12;
    }
    pxVar12 = (xmlDocPtr)(ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  local_98 = -(iVar13 + iVar1);
  bVar15 = true;
  while (bVar15) {
    iVar13 = xmlMemBlocks();
    xmlXPathCastNodeSetToBoolean(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 == iVar1) break;
    xmlMemBlocks();
    bVar15 = false;
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToBoolean");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_98 = local_98 + -1;
  }
  function_tests = function_tests + 1;
  bVar15 = true;
  while (bVar15) {
    iVar13 = xmlMemBlocks();
    xmlXPathCastNodeSetToNumber(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 == iVar1) break;
    xmlMemBlocks();
    bVar15 = false;
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToNumber");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_98 = local_98 + -1;
  }
  function_tests = function_tests + 1;
  bVar15 = true;
  while (bVar15) {
    iVar13 = xmlMemBlocks();
    lVar7 = xmlXPathCastNodeSetToString(0);
    if (lVar7 != 0) {
      (*_xmlFree)(lVar7);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 == iVar1) break;
    xmlMemBlocks();
    bVar15 = false;
    printf("Leak of %d blocks found in xmlXPathCastNodeSetToString");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_98 = local_98 + -1;
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar16,(int)in_RSI);
    xmlXPathCastNodeToNumber(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar16,(xmlNodePtr)in_RSI,nr);
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToNumber",(ulong)(uint)(iVar1 - iVar13));
      local_54 = local_54 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
    iVar1 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar16,(int)in_RSI);
    auVar18 = xmlXPathCastNodeToString(in_RSI);
    iVar13 = auVar18._8_4_;
    if (auVar18._0_8_ != 0) {
      (*_xmlFree)(auVar18._0_8_);
      iVar13 = extraout_EDX;
    }
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar16,(xmlNodePtr)in_RSI,iVar13);
    xmlResetLastError();
    iVar13 = xmlMemBlocks();
    if (iVar1 != iVar13) {
      iVar13 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNodeToString",(ulong)(uint)(iVar13 - iVar1));
      local_58 = local_58 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_5c = 0;
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    if (uVar16 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = _xmlXPathNAN;
      if (uVar16 != 2) {
        if (uVar16 == 1) {
          uVar9 = 0xbff199999999999a;
        }
        else {
          uVar9 = 0xbff0000000000000;
        }
      }
    }
    xmlXPathCastNumberToBoolean(uVar9);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToBoolean",(ulong)(uint)(iVar1 - iVar13))
      ;
      local_5c = local_5c + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    if (uVar16 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = _xmlXPathNAN;
      if (uVar16 != 2) {
        if (uVar16 == 1) {
          uVar9 = 0xbff199999999999a;
        }
        else {
          uVar9 = 0xbff0000000000000;
        }
      }
    }
    lVar7 = xmlXPathCastNumberToString(uVar9);
    if (lVar7 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastNumberToString",(ulong)(uint)(iVar1 - iVar13));
      local_60 = local_60 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar16,(int)in_RSI);
    xmlXPathCastStringToBoolean();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToBoolean",(ulong)(uint)(iVar1 - iVar13))
      ;
      local_64 = local_64 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar16,(int)in_RSI);
    xmlXPathCastStringToNumber();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastStringToNumber",(ulong)(uint)(iVar1 - iVar13));
      local_68 = local_68 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
    xmlXPathCastToBoolean();
    call_tests = call_tests + 1;
    if (pxVar8 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject();
    }
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToBoolean",(ulong)(uint)(iVar1 - iVar13));
      local_6c = local_6c + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
    xmlXPathCastToNumber();
    call_tests = call_tests + 1;
    if (pxVar8 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject();
    }
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToNumber",(ulong)(uint)(iVar1 - iVar13));
      local_70 = local_70 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_2 = 0;
  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
    iVar13 = xmlMemBlocks();
    pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
    lVar7 = xmlXPathCastToString();
    if (lVar7 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    if (pxVar8 != (xmlXPathObjectPtr)0x0) {
      xmlXPathFreeObject();
    }
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar13 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlXPathCastToString",(ulong)(uint)(iVar1 - iVar13));
      test_ret_2 = test_ret_2 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar16;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_3c = 0;
  uVar17 = 0;
  while (iVar13 = (int)uVar17, iVar13 != 3) {
    pxVar12 = (xmlDocPtr)0x0;
    while (iVar1 = (int)pxVar12, iVar1 != 3) {
      iVar2 = xmlMemBlocks();
      iVar3 = (int)in_RSI;
      val = gen_xmlNodePtr(iVar13,iVar3);
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar1,iVar3);
      xmlXPathCmpNodes(val,in_RSI);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar13,val,nr_00);
      des_xmlNodePtr(iVar1,(xmlNodePtr)in_RSI,nr_01);
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar2 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathCmpNodes",(ulong)(uint)(iVar3 - iVar2));
        local_3c = local_3c + 1;
        printf(" %d",uVar17);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar12;
      }
      pxVar12 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    uVar17 = (ulong)(iVar13 + 1);
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  bVar15 = true;
LAB_0014b776:
  do {
    if (!bVar15) {
      function_tests = function_tests + 1;
      test_ret_3 = 0;
      bVar15 = true;
LAB_0014b81c:
      do {
        if (!bVar15) {
          function_tests = function_tests + 1;
          uVar17 = 1;
          local_38 = 0;
          while (uVar17 != 0) {
            uVar14 = 0;
            while( true ) {
              uVar17 = 0;
              iVar13 = (int)uVar14;
              if (iVar13 == 4) break;
              while (iVar1 = (int)uVar17, iVar1 != 4) {
                pxVar12 = (xmlDocPtr)0x0;
                while (iVar2 = (int)pxVar12, iVar2 != 4) {
                  iVar3 = xmlMemBlocks();
                  iVar5 = (int)in_RSI;
                  uVar16 = gen_int(iVar13,iVar5);
                  iVar4 = gen_int(iVar1,iVar5);
                  iVar5 = gen_int(iVar2,iVar5);
                  in_RSI = (xmlDocPtr)(ulong)uVar16;
                  xmlXPathContextSetCache(0,in_RSI,iVar4,iVar5);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar4 = xmlMemBlocks();
                  if (iVar3 != iVar4) {
                    iVar4 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlXPathContextSetCache",
                           (ulong)(uint)(iVar4 - iVar3));
                    local_38 = local_38 + 1;
                    printf(" %d",0);
                    printf(" %d",uVar14);
                    printf(" %d",uVar17);
                    printf(" %d");
                    putchar(10);
                    in_RSI = pxVar12;
                  }
                  pxVar12 = (xmlDocPtr)(ulong)(iVar2 + 1);
                }
                uVar17 = (ulong)(iVar1 + 1);
              }
              uVar14 = (ulong)(iVar13 + 1);
            }
          }
          function_tests = function_tests + 1;
          local_78 = 0;
          for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
            iVar13 = xmlMemBlocks();
            pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
            uVar9 = xmlXPathConvertBoolean(pxVar8);
            xmlXPathFreeObject(uVar9);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar1 = xmlMemBlocks();
            if (iVar13 != iVar1) {
              iVar1 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlXPathConvertBoolean",
                     (ulong)(uint)(iVar1 - iVar13));
              local_78 = local_78 + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar16;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          local_7c = 0;
          for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
            iVar13 = xmlMemBlocks();
            pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
            uVar9 = xmlXPathConvertNumber(pxVar8);
            xmlXPathFreeObject(uVar9);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar1 = xmlMemBlocks();
            if (iVar13 != iVar1) {
              iVar1 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlXPathConvertNumber",
                     (ulong)(uint)(iVar1 - iVar13));
              local_7c = local_7c + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar16;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          local_80 = 0;
          for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
            iVar13 = xmlMemBlocks();
            pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
            uVar9 = xmlXPathConvertString(pxVar8);
            xmlXPathFreeObject(uVar9);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar1 = xmlMemBlocks();
            if (iVar13 != iVar1) {
              iVar1 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlXPathConvertString",
                     (ulong)(uint)(iVar1 - iVar13));
              local_80 = local_80 + 1;
              in_RSI = (xmlDocPtr)(ulong)uVar16;
              printf(" %d");
              putchar(10);
            }
          }
          function_tests = function_tests + 1;
          iVar13 = 0;
          local_4c = 0;
          do {
            if (iVar13 == 5) {
              function_tests = function_tests + 1;
              iVar13 = 0;
              local_50 = 0;
              do {
                if (iVar13 == 5) {
                  function_tests = function_tests + 1;
                  bVar15 = true;
                  test_ret_4 = 0;
                  while (bVar15) {
                    pxVar12 = (xmlDocPtr)0x0;
                    while (iVar13 = (int)pxVar12, iVar13 != 5) {
                      iVar1 = xmlMemBlocks();
                      pxVar11 = (xmlDocPtr)gen_xmlXPathObjectPtr(iVar13,(int)in_RSI);
                      in_RSI = pxVar11;
                      xmlXPathEvalPredicate(0);
                      call_tests = call_tests + 1;
                      if (pxVar11 != (xmlDocPtr)0x0) {
                        xmlXPathFreeObject(pxVar11);
                      }
                      xmlResetLastError();
                      iVar2 = xmlMemBlocks();
                      if (iVar1 != iVar2) {
                        iVar2 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlXPathEvalPredicate",
                               (ulong)(uint)(iVar2 - iVar1));
                        test_ret_4 = test_ret_4 + 1;
                        printf(" %d",0);
                        printf(" %d");
                        putchar(10);
                        in_RSI = pxVar12;
                      }
                      pxVar12 = (xmlDocPtr)(ulong)(iVar13 + 1);
                    }
                    bVar15 = false;
                  }
                  function_tests = function_tests + 1;
                  iVar13 = xmlMemBlocks();
                  xmlXPathInit();
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar1 = xmlMemBlocks();
                  if (iVar13 != iVar1) {
                    iVar2 = xmlMemBlocks();
                    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar2 - iVar13);
                    printf("Leak of %d blocks found in xmlXPathInit");
                    putchar(10);
                  }
                  function_tests = function_tests + 1;
                  local_84 = 0;
                  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
                    iVar2 = xmlMemBlocks();
                    if (uVar16 == 0) {
                      uVar9 = 0;
                    }
                    else {
                      uVar9 = _xmlXPathNAN;
                      if (uVar16 != 2) {
                        if (uVar16 == 1) {
                          uVar9 = 0xbff199999999999a;
                        }
                        else {
                          uVar9 = 0xbff0000000000000;
                        }
                      }
                    }
                    xmlXPathIsInf(uVar9);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar3 = xmlMemBlocks();
                    if (iVar2 != iVar3) {
                      iVar3 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlXPathIsInf",(ulong)(uint)(iVar3 - iVar2)
                            );
                      local_84 = local_84 + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar16;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  test_ret_5 = 0;
                  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
                    iVar2 = xmlMemBlocks();
                    if (uVar16 == 0) {
                      uVar9 = 0;
                    }
                    else {
                      uVar9 = _xmlXPathNAN;
                      if (uVar16 != 2) {
                        if (uVar16 == 1) {
                          uVar9 = 0xbff199999999999a;
                        }
                        else {
                          uVar9 = 0xbff0000000000000;
                        }
                      }
                    }
                    xmlXPathIsNaN(uVar9);
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar3 = xmlMemBlocks();
                    if (iVar2 != iVar3) {
                      iVar3 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlXPathIsNaN",(ulong)(uint)(iVar3 - iVar2)
                            );
                      test_ret_5 = test_ret_5 + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar16;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  iVar2 = 0;
                  for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
                    for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
                      bVar15 = true;
                      while (bVar15) {
                        iVar4 = xmlMemBlocks();
                        iVar5 = (int)in_RSI;
                        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar16,iVar5);
                        pxVar10 = gen_const_xmlChar_ptr(iVar3,iVar5);
                        uVar9 = xmlXPathNodeEval(in_RSI,pxVar10,0);
                        xmlXPathFreeObject(uVar9);
                        call_tests = call_tests + 1;
                        des_xmlNodePtr(uVar16,(xmlNodePtr)in_RSI,nr_02);
                        xmlResetLastError();
                        iVar5 = xmlMemBlocks();
                        if (iVar4 == iVar5) break;
                        iVar5 = xmlMemBlocks();
                        bVar15 = false;
                        printf("Leak of %d blocks found in xmlXPathNodeEval",
                               (ulong)(uint)(iVar5 - iVar4));
                        iVar2 = iVar2 + 1;
                        printf(" %d",(ulong)uVar16);
                        printf(" %d");
                        in_RSI = (xmlDocPtr)0x0;
                        printf(" %d");
                        putchar(10);
                      }
                    }
                  }
                  function_tests = function_tests + 1;
                  local_8c = 0;
                  for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
                    iVar3 = xmlMemBlocks();
                    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar16,(int)in_RSI);
                    uVar9 = xmlXPathNodeSetCreate(in_RSI);
                    xmlXPathFreeNodeSet(uVar9);
                    call_tests = call_tests + 1;
                    des_xmlNodePtr(uVar16,(xmlNodePtr)in_RSI,nr_03);
                    xmlResetLastError();
                    iVar4 = xmlMemBlocks();
                    if (iVar3 != iVar4) {
                      iVar4 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlXPathNodeSetCreate",
                             (ulong)(uint)(iVar4 - iVar3));
                      local_8c = local_8c + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar16;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  local_90 = 0;
                  for (uVar16 = 0; uVar16 != 5; uVar16 = uVar16 + 1) {
                    iVar3 = xmlMemBlocks();
                    pxVar8 = gen_xmlXPathObjectPtr(uVar16,(int)in_RSI);
                    uVar9 = xmlXPathObjectCopy(pxVar8);
                    xmlXPathFreeObject(uVar9);
                    call_tests = call_tests + 1;
                    if (pxVar8 != (xmlXPathObjectPtr)0x0) {
                      xmlXPathFreeObject(pxVar8);
                    }
                    xmlResetLastError();
                    iVar4 = xmlMemBlocks();
                    if (iVar3 != iVar4) {
                      iVar4 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlXPathObjectCopy",
                             (ulong)(uint)(iVar4 - iVar3));
                      local_90 = local_90 + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar16;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  test_ret_7 = 0;
                  for (uVar16 = 0; uVar16 != 4; uVar16 = uVar16 + 1) {
                    iVar3 = xmlMemBlocks();
                    pxVar12 = gen_xmlDocPtr(uVar16,(int)in_RSI);
                    xmlXPathOrderDocElems(pxVar12);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar12,in_RSI,nr_04);
                    xmlResetLastError();
                    iVar4 = xmlMemBlocks();
                    if (iVar3 != iVar4) {
                      iVar4 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlXPathOrderDocElems",
                             (ulong)(uint)(iVar4 - iVar3));
                      test_ret_7 = test_ret_7 + 1;
                      in_RSI = (xmlDocPtr)(ulong)uVar16;
                      printf(" %d");
                      putchar(10);
                    }
                  }
                  function_tests = function_tests + 1;
                  iVar3 = 0;
                  iVar4 = 0;
                  do {
                    if (iVar3 == 3) {
                      function_tests = function_tests + 1;
                      iVar13 = iVar2 + local_8c + local_90 + test_ret_7 + iVar4 +
                               local_80 + local_4c + local_50 + test_ret_4 + local_84 + test_ret_5 +
                               local_44 + test_ret_3 + local_38 + local_78 + local_7c +
                               local_6c + local_70 + test_ret_2 + local_3c +
                               local_60 + local_64 + local_68 +
                               local_58 + local_5c + (uint)(iVar13 != iVar1) + local_54;
                      uVar16 = -(local_98 - iVar13);
                      if (local_98 != iVar13) {
                        printf("Module xpath: %d errors\n",(ulong)uVar16);
                      }
                      return uVar16;
                    }
                    bVar15 = true;
                    while (iVar5 = (int)in_RSI, bVar15) {
                      iVar6 = xmlMemBlocks();
                      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar5);
                      xmlXPathSetContextNode(in_RSI,0);
                      call_tests = call_tests + 1;
                      des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_05);
                      xmlResetLastError();
                      iVar5 = xmlMemBlocks();
                      if (iVar6 == iVar5) break;
                      iVar5 = xmlMemBlocks();
                      bVar15 = false;
                      printf("Leak of %d blocks found in xmlXPathSetContextNode",
                             (ulong)(uint)(iVar5 - iVar6));
                      iVar4 = iVar4 + 1;
                      printf(" %d");
                      in_RSI = (xmlDocPtr)0x0;
                      printf(" %d");
                      putchar(10);
                    }
                    iVar3 = iVar3 + 1;
                  } while( true );
                }
                bVar15 = true;
                while (bVar15) {
                  iVar1 = xmlMemBlocks();
                  pxVar10 = gen_const_xmlChar_ptr(iVar13,(int)in_RSI);
                  in_RSI = (xmlDocPtr)0x0;
                  uVar9 = xmlXPathEvalExpression(pxVar10);
                  xmlXPathFreeObject(uVar9);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar2 = xmlMemBlocks();
                  if (iVar1 == iVar2) break;
                  iVar2 = xmlMemBlocks();
                  bVar15 = false;
                  printf("Leak of %d blocks found in xmlXPathEvalExpression",
                         (ulong)(uint)(iVar2 - iVar1));
                  local_50 = local_50 + 1;
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
                iVar13 = iVar13 + 1;
              } while( true );
            }
            bVar15 = true;
            while (bVar15) {
              iVar1 = xmlMemBlocks();
              pxVar10 = gen_const_xmlChar_ptr(iVar13,(int)in_RSI);
              in_RSI = (xmlDocPtr)0x0;
              uVar9 = xmlXPathEval(pxVar10);
              xmlXPathFreeObject(uVar9);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 == iVar2) break;
              iVar2 = xmlMemBlocks();
              bVar15 = false;
              printf("Leak of %d blocks found in xmlXPathEval",(ulong)(uint)(iVar2 - iVar1));
              local_4c = local_4c + 1;
              printf(" %d");
              in_RSI = (xmlDocPtr)0x0;
              printf(" %d");
              putchar(10);
            }
            iVar13 = iVar13 + 1;
          } while( true );
        }
        bVar15 = true;
        while (bVar15) {
          iVar13 = xmlMemBlocks();
          bVar15 = false;
          in_RSI = (xmlDocPtr)0x0;
          xmlXPathCompiledEvalToBoolean(0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar13 == iVar1) goto LAB_0014b81c;
          xmlMemBlocks();
          bVar15 = false;
          printf("Leak of %d blocks found in xmlXPathCompiledEvalToBoolean");
          test_ret_3 = test_ret_3 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        bVar15 = false;
      } while( true );
    }
    bVar15 = true;
    while (bVar15) {
      iVar13 = xmlMemBlocks();
      bVar15 = false;
      in_RSI = (xmlDocPtr)0x0;
      xmlXPathCompiledEval(0);
      xmlXPathFreeObject();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar13 == iVar1) goto LAB_0014b776;
      xmlMemBlocks();
      bVar15 = false;
      printf("Leak of %d blocks found in xmlXPathCompiledEval");
      local_44 = local_44 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar15 = false;
  } while( true );
}

Assistant:

static int
test_xpath(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xpath : 32 of 40 functions ...\n");
    test_ret += test_xmlXPathCastBooleanToNumber();
    test_ret += test_xmlXPathCastBooleanToString();
    test_ret += test_xmlXPathCastNodeSetToBoolean();
    test_ret += test_xmlXPathCastNodeSetToNumber();
    test_ret += test_xmlXPathCastNodeSetToString();
    test_ret += test_xmlXPathCastNodeToNumber();
    test_ret += test_xmlXPathCastNodeToString();
    test_ret += test_xmlXPathCastNumberToBoolean();
    test_ret += test_xmlXPathCastNumberToString();
    test_ret += test_xmlXPathCastStringToBoolean();
    test_ret += test_xmlXPathCastStringToNumber();
    test_ret += test_xmlXPathCastToBoolean();
    test_ret += test_xmlXPathCastToNumber();
    test_ret += test_xmlXPathCastToString();
    test_ret += test_xmlXPathCmpNodes();
    test_ret += test_xmlXPathCompile();
    test_ret += test_xmlXPathCompiledEval();
    test_ret += test_xmlXPathCompiledEvalToBoolean();
    test_ret += test_xmlXPathContextSetCache();
    test_ret += test_xmlXPathConvertBoolean();
    test_ret += test_xmlXPathConvertNumber();
    test_ret += test_xmlXPathConvertString();
    test_ret += test_xmlXPathCtxtCompile();
    test_ret += test_xmlXPathEval();
    test_ret += test_xmlXPathEvalExpression();
    test_ret += test_xmlXPathEvalPredicate();
    test_ret += test_xmlXPathInit();
    test_ret += test_xmlXPathIsInf();
    test_ret += test_xmlXPathIsNaN();
    test_ret += test_xmlXPathNewContext();
    test_ret += test_xmlXPathNodeEval();
    test_ret += test_xmlXPathNodeSetCreate();
    test_ret += test_xmlXPathObjectCopy();
    test_ret += test_xmlXPathOrderDocElems();
    test_ret += test_xmlXPathSetContextNode();

    if (test_ret != 0)
	printf("Module xpath: %d errors\n", test_ret);
    return(test_ret);
}